

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_phi3::llm_build_phi3
          (llm_build_phi3 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  uint32_t uVar2;
  llm_ffn_op_type lVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar6;
  const_reference pvVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  llama_hparams *name;
  undefined8 uVar12;
  int extraout_var;
  ggml_tensor *pgVar13;
  pointer plVar14;
  undefined8 in_RCX;
  long in_RSI;
  long in_RDI;
  float fVar15;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *attn_norm_output;
  ggml_tensor *rope_factors;
  ggml_tensor *residual;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_gqa;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd08;
  int iVar16;
  llama_hparams *in_stack_fffffffffffffd10;
  ggml_tensor *in_stack_fffffffffffffd18;
  ggml_tensor *in_stack_fffffffffffffd20;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffd28;
  undefined4 uVar17;
  ggml_tensor *cur_00;
  llm_graph_context *in_stack_fffffffffffffd30;
  ggml_tensor *in_stack_fffffffffffffd60;
  ggml_tensor *in_stack_fffffffffffffd68;
  llm_graph_context *in_stack_fffffffffffffd70;
  ggml_tensor *in_stack_fffffffffffffd88;
  ggml_tensor *in_stack_fffffffffffffd90;
  ggml_tensor *in_stack_fffffffffffffd98;
  ggml_tensor *in_stack_fffffffffffffda0;
  ggml_tensor *in_stack_fffffffffffffda8;
  ggml_tensor *in_stack_fffffffffffffdb0;
  ggml_tensor *in_stack_fffffffffffffdc0;
  ggml_tensor *in_stack_fffffffffffffdc8;
  ggml_tensor *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffdd8;
  ggml_tensor *pgVar18;
  llm_ffn_op_type lVar19;
  ggml_tensor *pgVar20;
  llm_ffn_gate_type type_gate;
  ggml_tensor *in_stack_fffffffffffffe00;
  _Head_base<0UL,_llm_graph_result_*,_false> in_stack_fffffffffffffe08;
  ggml_tensor *in_stack_fffffffffffffe10;
  ggml_tensor *in_stack_fffffffffffffe18;
  llm_graph_context *in_stack_fffffffffffffe20;
  llama_expert_gating_func_type gating_op;
  int il_00;
  undefined8 in_stack_fffffffffffffed0;
  ggml_tensor *in_stack_fffffffffffffed8;
  ggml_tensor *in_stack_fffffffffffffee0;
  ggml_tensor *in_stack_fffffffffffffee8;
  ggml_cgraph *in_stack_fffffffffffffef0;
  llm_graph_input_attn_kv_unified *in_stack_fffffffffffffef8;
  llm_graph_context *in_stack_ffffffffffffff00;
  undefined8 local_a0;
  ggml_tensor *local_98;
  ggml_cgraph *local_90;
  ggml_tensor *local_78;
  int local_6c;
  ggml_tensor *local_58;
  ggml_tensor *local_50;
  llm_graph_input_attn_kv_unified *plVar5;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffd20,
             (llm_graph_params *)in_stack_fffffffffffffd18);
  uVar1 = *(uint *)(*(long *)(in_RDI + 8) + 0x24);
  uVar2 = llama_hparams::n_embd_v_gqa
                    (in_stack_fffffffffffffd10,(uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20))
  ;
  if (uVar1 != *(uint *)(*(long *)(in_RDI + 8) + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1bd6,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_58 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  pgVar4 = llm_graph_context::build_inp_pos(in_stack_fffffffffffffd70);
  plVar5 = llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffdb0);
  lVar3 = (llm_ffn_op_type)plVar5;
  for (local_6c = 0; (long)local_6c < *(long *)(in_RDI + 0x28); local_6c = local_6c + 1) {
    local_78 = local_58;
    pgVar6 = std::function<ggml_tensor_*(unsigned_int,_int)>::operator()
                       ((function<ggml_tensor_*(unsigned_int,_int)> *)in_stack_fffffffffffffd10,
                        (uint)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                        (ggml_type)in_stack_fffffffffffffd08);
    iVar16 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
    pgVar13 = local_58;
    pgVar20 = pgVar6;
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_6c);
    pgVar18 = pvVar7->attn_norm;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_6c
              );
    pgVar8 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                        in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                        (int)in_stack_fffffffffffffd10);
    uVar17 = (undefined4)((ulong)in_stack_fffffffffffffd28 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar16);
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_6c);
    if (pvVar7->wqkv == (ggml_tensor *)0x0) {
      uVar10 = *(undefined8 *)(in_RDI + 0xc0);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_6c);
      pgVar9 = llm_graph_context::build_lora_mm
                         (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                          in_stack_fffffffffffffd60);
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      local_90 = (ggml_cgraph *)ggml_add(uVar10,pgVar9,pvVar7->bq);
      uVar10 = *(undefined8 *)(in_RDI + 0xc0);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_6c);
      pgVar9 = llm_graph_context::build_lora_mm
                         (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                          in_stack_fffffffffffffd60);
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      local_98 = (ggml_tensor *)ggml_add(uVar10,pgVar9,pvVar7->bk);
      uVar10 = *(undefined8 *)(in_RDI + 0xc0);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_6c);
      pgVar9 = llm_graph_context::build_lora_mm
                         (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                          in_stack_fffffffffffffd60);
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      local_a0 = ggml_add(uVar10,pgVar9,pvVar7->bv);
      pgVar9 = in_stack_fffffffffffffd90;
    }
    else {
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_6c);
      pgVar9 = llm_graph_context::build_lora_mm
                         (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                          in_stack_fffffffffffffd60);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 &in_stack_fffffffffffffd10->vocab_only,iVar16);
      in_stack_fffffffffffffef8 = *(llm_graph_input_attn_kv_unified **)(in_RDI + 0xc0);
      in_stack_ffffffffffffff00 =
           (llm_graph_context *)
           ggml_view_2d(in_stack_fffffffffffffef8,pgVar9,*(undefined8 *)(in_RDI + 0x20),
                        (long)*(int *)(in_RDI + 0xa8),pgVar9->nb[1],0);
      local_90 = (ggml_cgraph *)ggml_cont(in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
      in_stack_fffffffffffffee0 = *(ggml_tensor **)(in_RDI + 0xc0);
      in_stack_fffffffffffffef0 = local_90;
      in_stack_fffffffffffffee8 =
           (ggml_tensor *)
           ggml_view_2d(in_stack_fffffffffffffee0,pgVar9,uVar2,(long)*(int *)(in_RDI + 0xa8),
                        pgVar9->nb[1],*(long *)(in_RDI + 0x20) << 2);
      local_98 = (ggml_tensor *)ggml_cont(in_stack_fffffffffffffee0,in_stack_fffffffffffffee8);
      uVar10 = *(undefined8 *)(in_RDI + 0xc0);
      in_stack_fffffffffffffed8 = local_98;
      in_stack_fffffffffffffed0 = ggml_view_2d();
      local_a0 = ggml_cont(uVar10,in_stack_fffffffffffffed0);
      pgVar9 = in_stack_fffffffffffffd90;
    }
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar16);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar16);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar16);
    uVar10 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_90,uVar1,
                             *(undefined8 *)(in_RDI + 0x48),(long)*(int *)(in_RDI + 0xa8));
    uVar11 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_98,uVar1,
                             *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    name = (llama_hparams *)
           ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_a0,uVar1,
                           *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    uVar12 = ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                           *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                           *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                           *(undefined8 *)(in_RDI + 0xc0),uVar10,pgVar4,pgVar6,
                           *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                  *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                  *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                  *(undefined8 *)(in_RDI + 0xc0),uVar11,pgVar4,pgVar6,*(undefined4 *)(in_RDI + 0x30)
                  ,*(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar16);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar16);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar16);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    fVar15 = sqrtf((float)uVar1);
    ggml_scale(1.0 / fVar15,uVar10,uVar12);
    il_00 = (int)uVar10;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar16);
    lVar19 = lVar3;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_6c
              );
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_6c
              );
    cur_00 = (ggml_tensor *)CONCAT44(uVar17,local_6c);
    mw = (ggml_tensor *)0x0;
    pgVar6 = (ggml_tensor *)0x0;
    iVar16 = extraout_var;
    local_50 = llm_graph_context::build_attn
                         (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                          in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                          in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,pgVar13,pgVar18,pgVar8
                          ,pgVar20,(float)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)plVar5);
    pgVar18 = local_50;
    if ((long)local_6c == *(long *)(in_RDI + 0x28) + -1) {
      pgVar13 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffd60)
      ;
      in_stack_fffffffffffffe10 = pgVar13;
      local_50 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_50,pgVar13);
      in_stack_fffffffffffffe08._M_head_impl = (llm_graph_result *)local_50;
      in_stack_fffffffffffffe00 =
           (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_58,pgVar13);
      local_78 = in_stack_fffffffffffffe00;
    }
    gating_op = (llama_expert_gating_func_type)pgVar18;
    pgVar8 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_50,local_78);
    pgVar13 = pgVar8;
    pgVar18 = pgVar8;
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_6c);
    type_gate = (llm_ffn_gate_type)pgVar18;
    pgVar18 = pvVar7->ffn_norm;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_6c
              );
    in_stack_fffffffffffffd90 =
         llm_graph_context::build_norm
                   (in_stack_fffffffffffffd30,cur_00,mw,pgVar6,(llm_norm_type)((ulong)name >> 0x20),
                    (int)name);
    uVar17 = (undefined4)((ulong)cur_00 >> 0x20);
    pgVar20 = in_stack_fffffffffffffd90;
    llm_graph_context::cb((llm_graph_context *)mw,pgVar6,&name->vocab_only,iVar16);
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_6c);
    if (pvVar7->ffn_gate_inp == (ggml_tensor *)0x0) {
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      lVar19 = (llm_ffn_op_type)pgVar20;
      in_stack_fffffffffffffdc8 = pvVar7->ffn_up;
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      in_stack_fffffffffffffd18 = pvVar7->ffn_down;
      in_stack_fffffffffffffd30 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffd28 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd20 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd10 = (llama_hparams *)0x0;
      in_stack_fffffffffffffd08 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffdd0 = (ggml_tensor *)&stack0xfffffffffffffd08;
      local_50 = llm_graph_context::build_ffn
                           ((llm_graph_context *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8
                            ,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,pgVar9,
                            in_stack_fffffffffffffd88,in_stack_fffffffffffffd90,
                            in_stack_fffffffffffffdc8,(ggml_tensor *)&stack0xfffffffffffffd08,
                            in_stack_fffffffffffffdd8,pgVar13,pgVar18,lVar19,type_gate,
                            (int)in_stack_fffffffffffffe00);
      in_stack_fffffffffffffdc0 = in_stack_fffffffffffffd90;
      in_stack_fffffffffffffdd8 = local_50;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 &in_stack_fffffffffffffd10->vocab_only,
                 (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
      in_stack_fffffffffffffd90 = pgVar9;
    }
    else {
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      in_stack_fffffffffffffd98 = pvVar7->ffn_gate_inp;
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      in_stack_fffffffffffffda0 = pvVar7->ffn_up_exps;
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_6c);
      in_stack_fffffffffffffda8 = pvVar7->ffn_gate_exps;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_6c);
      in_stack_fffffffffffffd10 = *(llama_hparams **)(in_RDI + 0x78);
      in_stack_fffffffffffffd18 = *(ggml_tensor **)(in_RDI + 0x80);
      in_stack_fffffffffffffd30 =
           (llm_graph_context *)((ulong)in_stack_fffffffffffffd30 & 0xffffffff00000000);
      in_stack_fffffffffffffd28 = (ggml_tensor *)CONCAT44(uVar17,1);
      in_stack_fffffffffffffd20 = (ggml_tensor *)((ulong)mw & 0xffffffff00000000);
      in_stack_fffffffffffffd08 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffdb0 = (ggml_tensor *)&stack0xfffffffffffffd08;
      local_50 = llm_graph_context::build_moe_ffn
                           ((llm_graph_context *)pgVar20,pgVar18,pgVar13,in_stack_fffffffffffffdd8,
                            in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                            in_stack_fffffffffffffe00,
                            (int64_t)in_stack_fffffffffffffe08._M_head_impl,
                            (int64_t)in_stack_fffffffffffffe10,lVar19,
                            SUB81((ulong)in_stack_fffffffffffffdc0 >> 0x38,0),
                            SUB81((ulong)in_stack_fffffffffffffdc0 >> 0x30,0),
                            SUB84(in_stack_fffffffffffffdc0,0),gating_op,il_00);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 &in_stack_fffffffffffffd10->vocab_only,
                 (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    }
    in_stack_fffffffffffffd88 =
         (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar8,local_50);
    local_58 = llm_graph_context::build_cvec
                         ((llm_graph_context *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,0
                         );
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,
               (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
  }
  pgVar4 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                      in_stack_fffffffffffffd18,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                      (int)in_stack_fffffffffffffd10);
  iVar16 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             &in_stack_fffffffffffffd10->vocab_only,iVar16);
  plVar14 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4d3da0);
  plVar14->t_embd = pgVar4;
  local_50 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffd70,pgVar4,in_stack_fffffffffffffd60);
  if (*(long *)(in_RSI + 0x19a0) != 0) {
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               &in_stack_fffffffffffffd10->vocab_only,iVar16);
    local_50 = (ggml_tensor *)
               ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_50,*(undefined8 *)(in_RSI + 0x19a0));
  }
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             &in_stack_fffffffffffffd10->vocab_only,iVar16);
  plVar14 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4d3e99);
  plVar14->t_logits = local_50;
  ggml_build_forward_expand(in_RCX,local_50);
  return;
}

Assistant:

llm_build_phi3(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            auto * residual = inpL;

            // self-attention
            {
                // rope freq factors for 128k context
                ggml_tensor * rope_factors = static_cast<const llama_kv_cache_unified *>(memory)->cbs.get_rope_factors(n_ctx_per_seq, il);

                ggml_tensor* attn_norm_output = build_norm(inpL,
                        model.layers[il].attn_norm,
                        model.layers[il].attn_norm_b,
                        LLM_NORM_RMS, il);
                cb(attn_norm_output, "attn_norm", il);

                ggml_tensor * Qcur = nullptr;
                ggml_tensor * Kcur = nullptr;
                ggml_tensor * Vcur = nullptr;

                if (model.layers[il].wqkv) {
                    cur = build_lora_mm(model.layers[il].wqkv, attn_norm_output);
                    cb(cur, "wqkv", il);

                    Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0 * sizeof(float) * (n_embd)));
                    Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1 * sizeof(float) * (n_embd)));
                    Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1 * sizeof(float) * (n_embd + n_embd_gqa)));
                } else {
                    Qcur = ggml_add(ctx0, build_lora_mm(model.layers[il].wq, attn_norm_output), model.layers[il].bq);
                    Kcur = ggml_add(ctx0, build_lora_mm(model.layers[il].wk, attn_norm_output), model.layers[il].bk);
                    Vcur = ggml_add(ctx0, build_lora_mm(model.layers[il].wv, attn_norm_output), model.layers[il].bv);
                }

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, rope_factors,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, rope_factors,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_scale(ctx0, Qcur, 1.0f / sqrtf(float(n_embd_head)));
                cb(Qcur, "Qcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f, il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor* inp_out_ids = build_inp_out_ids();
                cur      = ggml_get_rows(ctx0, cur,      inp_out_ids);
                residual = ggml_get_rows(ctx0, residual, inp_out_ids);
            }

            cur = ggml_add(ctx0, cur, residual);
            residual = cur;

            cur = build_norm(cur,
                    model.layers[il].ffn_norm, model.layers[il].ffn_norm_b,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            // feed-forward network
            if (model.layers[il].ffn_gate_inp == nullptr) {
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        NULL,                      NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SWIGLU, LLM_FFN_SEQ, il);
                cb(cur, "ffn_out", il);
            } else {
                // MoE branch
                cur = build_moe_ffn(cur,
                        model.layers[il].ffn_gate_inp,
                        model.layers[il].ffn_up_exps,
                        model.layers[il].ffn_gate_exps,
                        model.layers[il].ffn_down_exps,
                        nullptr,
                        n_expert, n_expert_used,
                        LLM_FFN_SILU, true,
                        false, 0.0,
                        LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,
                        il);
                cb(cur, "ffn_moe_out", il);
            }

            cur = ggml_add(ctx0, residual, cur);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = build_norm(inpL,
                model.output_norm,
                model.output_norm_b,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        if (model.output_b != nullptr) {
            cb(cur, "result_output_no_bias", -1);
            cur = ggml_add(ctx0, cur, model.output_b);
        }

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }